

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitvec.cpp
# Opt level: O2

uint32_t window1(void *blob,int len,int start,int count)

{
  uint in_EAX;
  uint uVar1;
  uint32_t bit;
  uint8_t *b;
  ulong uStack_38;
  uint32_t t;
  
  uStack_38 = (ulong)in_EAX;
  for (bit = 0; (~(count >> 0x1f) & count) != bit; bit = bit + 1) {
    uVar1 = start % (len * 8) + bit;
    setbit(&t,4,bit,*(byte *)((long)blob + ((long)(ulong)(uVar1 >> 3) % (long)len & 0xffffffffU)) >>
                    ((byte)uVar1 & 7) & 1);
  }
  return t;
}

Assistant:

uint32_t window1 ( void * blob, int len, int start, int count )
{
  int nbits = len*8;
  start %= nbits;

  uint32_t t = 0;

  for(int i = 0; i < count; i++)
  {
    setbit(&t,sizeof(t),i, getbit_wrap(blob,len,start+i));
  }

  return t;
}